

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

atomic<unsigned_int> * __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t::operator[](data_t *this,size_t index)

{
  atomic<std::array<std::atomic<unsigned_int>,_128UL>_*> *this_00;
  bool bVar1;
  __pointer_type __p2;
  piece_t *piece;
  
  piece = (this->arr)._M_elems[index >> 7]._M_b._M_p;
  if (piece == (__pointer_type)0x0) {
    this_00 = (this->arr)._M_elems + (index >> 7);
    __p2 = (__pointer_type)operator_new(0x200);
    memset(__p2,0,0x200);
    bVar1 = std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>::compare_exchange_strong
                      (this_00,&piece,__p2,seq_cst);
    if (!bVar1) {
      operator_delete(__p2,0x200);
    }
    piece = (this_00->_M_b)._M_p;
  }
  return piece->_M_elems + ((uint)index & 0x7f);
}

Assistant:

std::atomic<uint_type>& operator[](std::size_t index) {
      piece_t* piece = arr[index / piece_size];
      if (piece == nullptr) {
        auto ptr = new piece_t{};
        if (!arr[index / piece_size].compare_exchange_strong(piece, ptr)) {
          delete ptr;
        }
        return (*arr[index / piece_size].load())[index % piece_size];
      }
      else {
        return (*piece)[index % piece_size];
      }
    }